

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spolynomials.cpp
# Opt level: O0

void opengv::absolute_pose::modules::gp3p::sPolynomial9
               (Matrix<double,_48,_85,_0,_48,_85> *groebnerMatrix)

{
  double dVar1;
  double dVar2;
  Scalar *pSVar3;
  double dVar4;
  double dVar5;
  Index in_stack_fffffffffffffe78;
  Scalar row;
  DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1> *in_stack_fffffffffffffe80;
  DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1> *this;
  
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,0x8e9a35);
  row = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (in_stack_fffffffffffffe80,(Index)row,0x8e9a54);
  dVar4 = row / *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (in_stack_fffffffffffffe80,(Index)row,0x8e9a7a);
  this = (DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1> *)*pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8e9a9b);
  dVar5 = (double)this / *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8e9acc);
  *pSVar3 = dVar4 - dVar5;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8e9aec);
  dVar4 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8e9b0c);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8e9b33);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8e9b54);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8e9b85);
  *pSVar3 = dVar4 / dVar5 - dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8e9ba5);
  dVar4 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8e9bc5);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8e9bec);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8e9c0d);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8e9c3e);
  *pSVar3 = dVar4 / dVar5 - dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8e9c5e);
  dVar4 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8e9c7e);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8e9ca5);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8e9cc6);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8e9cf7);
  *pSVar3 = dVar4 / dVar5 - dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8e9d18);
  dVar4 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8e9d53);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8e9d80);
  *pSVar3 = -dVar4 / dVar5;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8e9da3);
  dVar4 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8e9dc6);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8e9df3);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8e9e17);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8e9e51);
  *pSVar3 = dVar4 / dVar5 - dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8e9e74);
  dVar4 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8e9e97);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8e9ec4);
  *pSVar3 = dVar4 / dVar5;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8e9ee7);
  dVar4 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8e9f0a);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8e9f37);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8e9f5b);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8e9f95);
  *pSVar3 = dVar4 / dVar5 - dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8e9fb8);
  dVar4 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8e9fdb);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8ea008);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8ea02c);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8ea066);
  *pSVar3 = dVar4 / dVar5 - dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8ea089);
  dVar4 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8ea0ac);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8ea0d9);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8ea0fd);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8ea137);
  *pSVar3 = dVar4 / dVar5 - dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8ea15a);
  dVar4 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8ea17d);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8ea1aa);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8ea1ce);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8ea208);
  *pSVar3 = dVar4 / dVar5 - dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8ea22b);
  dVar4 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8ea24e);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8ea27b);
  *pSVar3 = dVar4 / dVar5;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8ea29f);
  dVar4 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8ea2da);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8ea307);
  *pSVar3 = -dVar4 / dVar5;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8ea32a);
  dVar4 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8ea34d);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8ea37a);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8ea39e);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8ea3d8);
  *pSVar3 = dVar4 / dVar5 - dVar1 / dVar2;
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gp3p::sPolynomial9( Eigen::Matrix<double,48,85> & groebnerMatrix )
{
  groebnerMatrix(9,21) = (groebnerMatrix(0,21)/(groebnerMatrix(0,20))-groebnerMatrix(1,21)/(groebnerMatrix(1,20)));
  groebnerMatrix(9,33) = (groebnerMatrix(0,33)/(groebnerMatrix(0,20))-groebnerMatrix(1,33)/(groebnerMatrix(1,20)));
  groebnerMatrix(9,53) = (groebnerMatrix(0,53)/(groebnerMatrix(0,20))-groebnerMatrix(1,53)/(groebnerMatrix(1,20)));
  groebnerMatrix(9,66) = (groebnerMatrix(0,66)/(groebnerMatrix(0,20))-groebnerMatrix(1,66)/(groebnerMatrix(1,20)));
  groebnerMatrix(9,70) = -groebnerMatrix(1,70)/(groebnerMatrix(1,20));
  groebnerMatrix(9,71) = (groebnerMatrix(0,71)/(groebnerMatrix(0,20))-groebnerMatrix(1,71)/(groebnerMatrix(1,20)));
  groebnerMatrix(9,75) = groebnerMatrix(0,75)/(groebnerMatrix(0,20));
  groebnerMatrix(9,76) = (groebnerMatrix(0,76)/(groebnerMatrix(0,20))-groebnerMatrix(1,76)/(groebnerMatrix(1,20)));
  groebnerMatrix(9,77) = (groebnerMatrix(0,77)/(groebnerMatrix(0,20))-groebnerMatrix(1,77)/(groebnerMatrix(1,20)));
  groebnerMatrix(9,80) = (groebnerMatrix(0,80)/(groebnerMatrix(0,20))-groebnerMatrix(1,80)/(groebnerMatrix(1,20)));
  groebnerMatrix(9,81) = (groebnerMatrix(0,81)/(groebnerMatrix(0,20))-groebnerMatrix(1,81)/(groebnerMatrix(1,20)));
  groebnerMatrix(9,82) = groebnerMatrix(0,82)/(groebnerMatrix(0,20));
  groebnerMatrix(9,83) = -groebnerMatrix(1,83)/(groebnerMatrix(1,20));
  groebnerMatrix(9,84) = (groebnerMatrix(0,84)/(groebnerMatrix(0,20))-groebnerMatrix(1,84)/(groebnerMatrix(1,20)));
}